

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O2

void __thiscall
phmap::priv::
raw_hash_set<phmap::priv::FlatHashMapPolicy<cs_impl::any,cs::statement_block*>,phmap::Hash<cs_impl::any>,phmap::EqualTo<cs_impl::any>,std::allocator<std::pair<cs_impl::any_const,cs::statement_block*>>>
::
emplace_at<std::piecewise_construct_t_const&,std::tuple<cs_impl::any_const&>,std::tuple<cs::statement_block*&&>>
          (raw_hash_set<phmap::priv::FlatHashMapPolicy<cs_impl::any,cs::statement_block*>,phmap::Hash<cs_impl::any>,phmap::EqualTo<cs_impl::any>,std::allocator<std::pair<cs_impl::any_const,cs::statement_block*>>>
           *this,size_t i,piecewise_construct_t *args,tuple<const_cs_impl::any_&> *args_1,
          tuple<cs::statement_block_*&&> *args_2)

{
  long lVar1;
  statement_block **ppsVar2;
  proxy *ppVar3;
  
  lVar1 = *(long *)(this + 8);
  ppsVar2 = (args_2->super__Tuple_impl<0UL,_cs::statement_block_*&&>).
            super__Head_base<0UL,_cs::statement_block_*&&,_false>._M_head_impl;
  ppVar3 = ((args_1->super__Tuple_impl<0UL,_const_cs_impl::any_&>).
            super__Head_base<0UL,_const_cs_impl::any_&,_false>._M_head_impl)->mDat;
  if (ppVar3 != (proxy *)0x0) {
    ppVar3->refcount = ppVar3->refcount + 1;
  }
  *(proxy **)(lVar1 + i * 0x10) = ppVar3;
  *(statement_block **)(lVar1 + 8 + i * 0x10) = *ppsVar2;
  return;
}

Assistant:

void emplace_at(size_t i, Args&&... args)
			{
				PolicyTraits::construct(&alloc_ref(), slots_ + i,
				                        std::forward<Args>(args)...);

#ifdef PHMAP_CHECK_CONSTRUCTED_VALUE
				// this check can be costly, so do it only when requested
				assert(PolicyTraits::apply(FindElement{*this}, *iterator_at(i)) ==
				       iterator_at(i) &&
				       "constructed value does not match the lookup key");
#endif
			}